

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastops_ut.cpp
# Opt level: O3

void TestFunc<TAvxTanh<false,true>,TTanhCompare<false,true>,double>
               (mt19937_64 *rng,TTestExpOpts opts)

{
  uint uVar1;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *__urng;
  double *pdVar2;
  pointer pcVar3;
  bool bVar4;
  ostream *poVar5;
  FastOpsTestException *pFVar6;
  double *pdVar7;
  double *from;
  pointer pcVar8;
  long lVar9;
  ulong uVar10;
  size_t size;
  long lVar11;
  _Adaptor<std::mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>,_double>
  __aurng;
  long lVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  vector<char,_std::allocator<char>_> outV;
  vector<char,_std::allocator<char>_> inV;
  ostringstream out;
  string local_268;
  ulong local_248;
  double *local_240;
  double *local_238;
  vector<char,_std::allocator<char>_> local_230;
  vector<char,_std::allocator<char>_> local_218;
  double *local_200;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *local_1f8;
  long local_1f0;
  long local_1e8;
  ulong local_1e0;
  ulong local_1d8;
  long local_1d0;
  double local_1c8;
  undefined8 uStack_1c0;
  double local_1b8;
  undefined8 uStack_1b0;
  allocator_type local_1a8 [376];
  
  std::vector<char,_std::allocator<char>_>::vector
            (&local_218,(opts.PadSize + opts.VecSize) * 8 + 0x20,local_1a8);
  std::vector<char,_std::allocator<char>_>::vector
            (&local_230,(opts.PadSize + opts.VecSize) * 8 + 0x40,local_1a8);
  uVar1 = (int)opts.PadSize * 4 & 0xfffffff8;
  pdVar2 = (double *)
           local_218.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
           ._M_start;
  do {
    pdVar7 = pdVar2;
    pdVar2 = (double *)((long)pdVar7 + 1);
    pcVar3 = local_230.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
  } while (((int)pdVar7 + uVar1 & 0x1f) != opts.InputAlignBytes);
  do {
    pcVar8 = pcVar3;
    pcVar3 = pcVar8 + 1;
  } while (((int)pcVar8 + uVar1 & 0x1f) != opts.OutputAlignBytes);
  uVar10 = opts.PadSize >> 1;
  pdVar2 = pdVar7 + uVar10;
  local_238 = (double *)(pcVar8 + uVar10 * 8);
  from = pdVar2;
  if (opts.Inplace != false) {
    from = local_238;
  }
  if (opts.VecSize != 1 || opts.N != 0xffffffffffffffff) {
    local_1f0 = uVar10 * 8;
    local_1d0 = (long)pdVar7 + 1 + local_1f0 + -1;
    local_248 = 0;
    local_200 = pdVar7;
    local_1f8 = rng;
    local_1d8 = uVar10;
    do {
      __urng = local_1f8;
      memset(local_218.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,0,
             (long)local_218.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_218.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start);
      memset(local_230.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,0,
             (long)local_230.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_230.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start);
      if (opts.VecSize == 0) {
        size = 0;
      }
      else {
        uVar10 = 0;
        do {
          if (opts.IsRandom == true) {
            dVar13 = std::
                     generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                               (__urng);
            dVar13 = (double)(opts.Max - opts.Min) * (dVar13 + 0.0);
            dVar14 = (double)opts.Min;
          }
          else {
            local_240 = (double *)CONCAT44(local_240._4_4_,opts.Min);
            dVar15 = std::
                     generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                               (__urng);
            lVar9 = opts.VecSize * local_248 + uVar10;
            auVar16._8_4_ = (int)((ulong)lVar9 >> 0x20);
            auVar16._0_8_ = lVar9;
            auVar16._12_4_ = 0x45300000;
            auVar17._8_4_ = opts.N._4_4_;
            auVar17._0_8_ = opts.N;
            auVar17._12_4_ = 0x45300000;
            dVar14 = (auVar17._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)opts.N) - 4503599627370496.0);
            dVar13 = (double)local_240._0_4_ +
                     (double)(opts.Max - local_240._0_4_) *
                     (((auVar16._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) / dVar14);
            dVar14 = (dVar15 + 0.0 + dVar15 + 0.0 + -1.0) / dVar14;
          }
          dVar14 = dVar14 + dVar13;
          if ((1 < opts.Func - Sigmoid) && (opts.Func != Exp)) {
            if (opts.Func != Log) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"assertion failed ",0x11);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"false",5);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," at ",4);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"TestFunc",8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/yandex[P]fastops/fastops/ut/fastops_ut.cpp"
                         ,0x5c);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              std::ostream::operator<<((ostream *)local_1a8,0x7f);
              pFVar6 = (FastOpsTestException *)__cxa_allocate_exception(0x28);
              std::__cxx11::stringbuf::str();
              FastOpsTestException::FastOpsTestException(pFVar6,&local_268);
              __cxa_throw(pFVar6,&FastOpsTestException::typeinfo,
                          FastOpsTestException::~FastOpsTestException);
            }
            dVar14 = exp(dVar14);
          }
          from[uVar10] = dVar14;
          *(double *)(local_1d0 + uVar10 * 8) = dVar14;
          uVar10 = uVar10 + 1;
          size = opts.VecSize;
        } while (uVar10 < opts.VecSize);
      }
      NFastOps::TanhAvx<false,true>(from,size,local_238);
      lVar9 = opts.PadSize + opts.VecSize;
      if (opts.Inplace == false) {
        if (lVar9 != 0) {
          pdVar7 = local_200;
          lVar12 = lVar9;
          do {
            if ((pdVar7 < from || from + opts.VecSize <= pdVar7) &&
               ((*pdVar7 != 0.0 || (NAN(*pdVar7))))) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"assertion failed ",0x11);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ReadUnaligned<T>(inDataStart + j) == 0",0x26);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," at ",4);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"TestFunc",8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/yandex[P]fastops/fastops/ut/fastops_ut.cpp"
                         ,0x5c);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              std::ostream::operator<<((ostream *)local_1a8,0x8a);
              pFVar6 = (FastOpsTestException *)__cxa_allocate_exception(0x28);
              std::__cxx11::stringbuf::str();
              FastOpsTestException::FastOpsTestException(pFVar6,&local_268);
              __cxa_throw(pFVar6,&FastOpsTestException::typeinfo,
                          FastOpsTestException::~FastOpsTestException);
            }
            pdVar7 = pdVar7 + 1;
            lVar12 = lVar12 + -1;
          } while (lVar12 != 0);
          goto LAB_0016b0dd;
        }
      }
      else if (lVar9 != 0) {
LAB_0016b0dd:
        local_240 = local_238 + opts.VecSize;
        local_1e0 = (ulong)opts.Func;
        lVar12 = 0;
        local_1e8 = lVar9;
        do {
          pdVar7 = (double *)(pcVar8 + lVar12 * 8);
          if ((lVar12 < (long)local_1d8) || (local_240 <= pdVar7)) {
            if ((*pdVar7 != 0.0) || (NAN(*pdVar7))) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"assertion failed ",0x11);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ReadUnaligned<T>(outDataStart + j) == 0",0x27);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," at ",4);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"TestFunc",8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/yandex[P]fastops/fastops/ut/fastops_ut.cpp"
                         ,0x5c);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              std::ostream::operator<<((ostream *)local_1a8,0x91);
              pFVar6 = (FastOpsTestException *)__cxa_allocate_exception(0x28);
              std::__cxx11::stringbuf::str();
              FastOpsTestException::FastOpsTestException(pFVar6,&local_268);
              __cxa_throw(pFVar6,&FastOpsTestException::typeinfo,
                          FastOpsTestException::~FastOpsTestException);
            }
          }
          else {
            if (Tanh < opts.Func) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"assertion failed ",0x11);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"false",5);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," at ",4);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"TestFunc",8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/yandex[P]fastops/fastops/ut/fastops_ut.cpp"
                         ,0x5c);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              std::ostream::operator<<((ostream *)local_1a8,0xac);
              pFVar6 = (FastOpsTestException *)__cxa_allocate_exception(0x28);
              std::__cxx11::stringbuf::str();
              FastOpsTestException::FastOpsTestException(pFVar6,&local_268);
              __cxa_throw(pFVar6,&FastOpsTestException::typeinfo,
                          FastOpsTestException::~FastOpsTestException);
            }
            lVar11 = lVar12 * 8 - local_1f0;
            switch((long)&switchD_0016b158::switchdataD_00192798 +
                   (long)(int)(&switchD_0016b158::switchdataD_00192798)[local_1e0]) {
            case 0x16b15a:
              local_1b8 = exp(*(double *)((long)pdVar2 + lVar11));
              uStack_1b0 = extraout_XMM0_Qb;
              break;
            case 0x16b18b:
              dVar13 = exp(-*(double *)((long)pdVar2 + lVar11));
              local_1b8 = 1.0 / (dVar13 + 1.0);
              uStack_1b0 = 0;
              break;
            case 0x16b1b5:
              local_1b8 = tanh(*(double *)((long)pdVar2 + lVar11));
              uStack_1b0 = extraout_XMM0_Qb_00;
              break;
            case 0x16b1c7:
              local_1b8 = log(*(double *)((long)pdVar2 + lVar11));
              uStack_1b0 = extraout_XMM0_Qb_01;
            }
            local_1c8 = *pdVar7;
            uStack_1c0 = 0;
            bVar4 = TTanhCompare<false,_true>::Compare
                              (*(double *)((long)pdVar2 + lVar11),local_1b8,local_1c8);
            lVar9 = local_1e8;
            if (!bVar4) {
              poVar5 = std::ostream::_M_insert<double>(*(double *)((long)pdVar2 + lVar11));
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
              poVar5 = std::ostream::_M_insert<double>(local_1b8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
              poVar5 = std::ostream::_M_insert<double>(local_1c8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
              poVar5 = std::ostream::_M_insert<double>
                                 (ABS(local_1c8 - local_1b8) / (ABS(local_1b8) + 1e-100));
              std::endl<char,std::char_traits<char>>(poVar5);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"assertion failed ",0x11);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"false",5);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," at ",4);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"TestFunc",8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/yandex[P]fastops/fastops/ut/fastops_ut.cpp"
                         ,0x5c);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              std::ostream::operator<<((ostream *)local_1a8,0xb1);
              pFVar6 = (FastOpsTestException *)__cxa_allocate_exception(0x28);
              std::__cxx11::stringbuf::str();
              FastOpsTestException::FastOpsTestException(pFVar6,&local_268);
              __cxa_throw(pFVar6,&FastOpsTestException::typeinfo,
                          FastOpsTestException::~FastOpsTestException);
            }
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != lVar9);
      }
      local_248 = local_248 + 1;
    } while (local_248 < opts.N / opts.VecSize + 1);
  }
  if (local_230.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_230.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_230.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_230.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((double *)
      local_218.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_218.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_218.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_218.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TestFunc(std::mt19937_64& rng, TTestExpOpts opts) {
    std::vector<char> inV((opts.VecSize + opts.PadSize) * sizeof(T) + 32);
    std::vector<char> outV((opts.VecSize + opts.PadSize + 4) * sizeof(T) + 32);
    std::uniform_real_distribution<> dis(0, 1.0);

    size_t padOffset = opts.PadSize / 2;
    padOffset *= sizeof(T);

    char* inVCharData = inV.data();
    char* outVCharData = outV.data();
    while ((size_t)(inVCharData + padOffset) % 32 != opts.InputAlignBytes) {
        ++inVCharData;
    }
    while ((size_t)(outVCharData + padOffset) % 32 != opts.OutputAlignBytes) {
        ++outVCharData;
    }

    T* inDataStart = (T*)inVCharData;
    T* inData = inDataStart + opts.PadSize / 2;
    T* origInData = inData;
    T* outDataStart = (T*)outVCharData;
    T* outData = outDataStart + opts.PadSize / 2;

    if (opts.Inplace) {
        inData = outData;
    }

    for (size_t i = 0; i < opts.N / opts.VecSize + 1; ++i) {
        std::memset(inV.data(), 0, inV.size());
        std::memset(outV.data(), 0, outV.size());
        for (size_t j = 0; j < opts.VecSize; ++j) {
            T val;
            if (opts.IsRandom) {
                val = dis(rng) * (opts.Max - opts.Min) + opts.Min;
            } else {
                size_t idx = opts.VecSize * i + j;
                val = opts.Min + idx * 1.0 / opts.N * (opts.Max - opts.Min) + (2 * dis(rng) - 1) * 1.0 / opts.N;
            }

            switch (opts.Func) {
                case EFunc::Log:
                    val = exp(val);
                    break;
                case EFunc::Exp:
                case EFunc::Sigmoid:
                case EFunc::Tanh:
                    break;
                default:
                    UNIT_ASSERT(false);
            }

            WriteUnaligned(inData + j, val);
            WriteUnaligned(origInData + j, val);
        }

        TFunc::Apply(inData, opts.VecSize, outData);
        if (!opts.Inplace) {
            for (size_t j = 0; j < opts.VecSize + opts.PadSize; ++j) {
                if (inDataStart + j < inData || inDataStart + j >= inData + opts.VecSize) {
                    UNIT_ASSERT(ReadUnaligned<T>(inDataStart + j) == 0);
                }
            }
        }

        for (size_t j = 0; j < opts.VecSize + opts.PadSize; ++j) {
            if (outDataStart + j < outData || outDataStart + j >= outData + opts.VecSize) {
                UNIT_ASSERT(ReadUnaligned<T>(outDataStart + j) == 0);
            } else {
                size_t j2 = outDataStart + j - outData;
                T trueVal;
                T approxVal;
                switch (opts.Func) {
                    case EFunc::Log: {
                        trueVal = log(ReadUnaligned<T>(origInData + j2));
                        approxVal = ReadUnaligned<T>(outDataStart + j);
                        break;
                    }
                    case EFunc::Exp: {
                        trueVal = exp(ReadUnaligned<T>(origInData + j2));
                        approxVal = ReadUnaligned<T>(outDataStart + j);
                        break;
                    }
                    case EFunc::Sigmoid: {
                        trueVal = 1.0 / (1.0 + exp(-ReadUnaligned<T>(origInData + j2)));
                        approxVal = ReadUnaligned<T>(outDataStart + j);
                        break;
                    }
                    case EFunc::Tanh: {
                        trueVal = tanh(ReadUnaligned<T>(origInData + j2));
                        approxVal = ReadUnaligned<T>(outDataStart + j);
                        break;
                    }
                    default:
                        UNIT_ASSERT(false);
                }

                if (!TCompare::Compare(ReadUnaligned<T>(origInData + j2), trueVal, approxVal)) {
                    std::cerr << ReadUnaligned<T>(origInData + j2) << "\t" << trueVal << "\t" << approxVal << "\t" << GetRelError(trueVal, approxVal) << std::endl;
                    UNIT_ASSERT(false);
                }
            }
        }
    }
}